

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
CompilerVersionNode::EvaluateWithLanguage
          (string *__return_storage_ptr__,CompilerVersionNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4,string *lang)

{
  cmMakefile *this_00;
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  char *rhss;
  char *pcVar4;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = context->LG->Makefile;
  std::operator+(&local_50,"CMAKE_",lang);
  std::operator+(&local_70,&local_50,"_COMPILER_VERSION");
  rhss = cmMakefile::GetSafeDefinition(this_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if ((parameters->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (parameters->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    pcVar4 = "";
    if (rhss != (char *)0x0) {
      pcVar4 = rhss;
    }
  }
  else {
    if ((EvaluateWithLanguage(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
         ::compilerIdValidator == '\0') &&
       (iVar3 = __cxa_guard_acquire(&EvaluateWithLanguage(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
                                     ::compilerIdValidator), iVar3 != 0)) {
      cmsys::RegularExpression::RegularExpression
                (&EvaluateWithLanguage::compilerIdValidator,"^[0-9\\.]*$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                   &EvaluateWithLanguage::compilerIdValidator,&__dso_handle);
      __cxa_guard_release(&EvaluateWithLanguage(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
                           ::compilerIdValidator);
    }
    bVar2 = cmsys::RegularExpression::find
                      (&EvaluateWithLanguage::compilerIdValidator,
                       (parameters->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    if (!bVar2) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_70,content);
      std::__cxx11::string::string
                ((string *)&local_50,"Expression syntax not recognized.",&local_71);
      reportError(context,&local_70,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    pbVar1 = (parameters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (rhss == (char *)0x0) {
      pcVar4 = "0";
      if (pbVar1->_M_string_length == 0) {
        pcVar4 = "1";
      }
    }
    else {
      bVar2 = cmSystemTools::VersionCompare(OP_EQUAL,(pbVar1->_M_dataplus)._M_p,rhss);
      pcVar4 = "0";
      if (bVar2) {
        pcVar4 = "1";
      }
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,(allocator *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string EvaluateWithLanguage(const std::vector<std::string> &parameters,
                       cmGeneratorExpressionContext *context,
                       const GeneratorExpressionContent *content,
                       cmGeneratorExpressionDAGChecker *,
                       const std::string &lang) const
  {
    const char *compilerVersion =
        context->LG->GetMakefile()->GetSafeDefinition(
          "CMAKE_" + lang + "_COMPILER_VERSION");
    if (parameters.empty())
      {
      return compilerVersion ? compilerVersion : "";
      }

    static cmsys::RegularExpression compilerIdValidator("^[0-9\\.]*$");
    if (!compilerIdValidator.find(*parameters.begin()))
      {
      reportError(context, content->GetOriginalExpression(),
                  "Expression syntax not recognized.");
      return std::string();
      }
    if (!compilerVersion)
      {
      return parameters.front().empty() ? "1" : "0";
      }

    return cmSystemTools::VersionCompare(cmSystemTools::OP_EQUAL,
                                      parameters.begin()->c_str(),
                                      compilerVersion) ? "1" : "0";
  }